

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_sCAL_s(png_const_structrp png_ptr,png_inforp info_ptr,int unit,png_const_charp swidth,
                   png_const_charp sheight)

{
  byte *pbVar1;
  int iVar2;
  size_t size;
  size_t size_00;
  png_charp pcVar3;
  char *error_message;
  
  if (info_ptr == (png_inforp)0x0 || png_ptr == (png_const_structrp)0x0) {
    return;
  }
  if (unit - 3U < 0xfffffffe) {
    error_message = "Invalid sCAL unit";
  }
  else if ((((swidth == (png_const_charp)0x0) || (size = strlen(swidth), size == 0)) ||
           (*swidth == '-')) || (iVar2 = png_check_fp_string(swidth,size), iVar2 == 0)) {
    error_message = "Invalid sCAL width";
  }
  else {
    if (((sheight != (png_const_charp)0x0) && (size_00 = strlen(sheight), size_00 != 0)) &&
       ((*sheight != '-' && (iVar2 = png_check_fp_string(sheight,size_00), iVar2 != 0)))) {
      info_ptr->scal_unit = (png_byte)unit;
      pcVar3 = (png_charp)png_malloc_warn(png_ptr,size + 1);
      info_ptr->scal_s_width = pcVar3;
      if (pcVar3 != (png_charp)0x0) {
        memcpy(pcVar3,swidth,size + 1);
        pcVar3 = (png_charp)png_malloc_warn(png_ptr,size_00 + 1);
        info_ptr->scal_s_height = pcVar3;
        if (pcVar3 != (png_charp)0x0) {
          memcpy(pcVar3,sheight,size_00 + 1);
          pbVar1 = (byte *)((long)&info_ptr->valid + 1);
          *pbVar1 = *pbVar1 | 0x40;
          pbVar1 = (byte *)((long)&info_ptr->free_me + 1);
          *pbVar1 = *pbVar1 | 1;
          return;
        }
        png_free(png_ptr,info_ptr->scal_s_width);
        info_ptr->scal_s_width = (png_charp)0x0;
      }
      png_warning(png_ptr,"Memory allocation failed while processing sCAL");
      return;
    }
    error_message = "Invalid sCAL height";
  }
  png_error(png_ptr,error_message);
}

Assistant:

void PNGAPI
png_set_sCAL_s(png_const_structrp png_ptr, png_inforp info_ptr,
    int unit, png_const_charp swidth, png_const_charp sheight)
{
   size_t lengthw = 0, lengthh = 0;

   png_debug1(1, "in %s storage function", "sCAL");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   /* Double check the unit (should never get here with an invalid
    * unit unless this is an API call.)
    */
   if (unit != 1 && unit != 2)
      png_error(png_ptr, "Invalid sCAL unit");

   if (swidth == NULL || (lengthw = strlen(swidth)) == 0 ||
       swidth[0] == 45 /* '-' */ || !png_check_fp_string(swidth, lengthw))
      png_error(png_ptr, "Invalid sCAL width");

   if (sheight == NULL || (lengthh = strlen(sheight)) == 0 ||
       sheight[0] == 45 /* '-' */ || !png_check_fp_string(sheight, lengthh))
      png_error(png_ptr, "Invalid sCAL height");

   info_ptr->scal_unit = (png_byte)unit;

   ++lengthw;

   png_debug1(3, "allocating unit for info (%u bytes)", (unsigned int)lengthw);

   info_ptr->scal_s_width = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, lengthw));

   if (info_ptr->scal_s_width == NULL)
   {
      png_warning(png_ptr, "Memory allocation failed while processing sCAL");

      return;
   }

   memcpy(info_ptr->scal_s_width, swidth, lengthw);

   ++lengthh;

   png_debug1(3, "allocating unit for info (%u bytes)", (unsigned int)lengthh);

   info_ptr->scal_s_height = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, lengthh));

   if (info_ptr->scal_s_height == NULL)
   {
      png_free (png_ptr, info_ptr->scal_s_width);
      info_ptr->scal_s_width = NULL;

      png_warning(png_ptr, "Memory allocation failed while processing sCAL");

      return;
   }

   memcpy(info_ptr->scal_s_height, sheight, lengthh);

   info_ptr->valid |= PNG_INFO_sCAL;
   info_ptr->free_me |= PNG_FREE_SCAL;
}